

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_unknown_extension
              (ptls_t *tls,ptls_handshake_properties_t *properties,uint16_t type,uint8_t *src,
              uint8_t *end,ptls_raw_extension_t *slots)

{
  int iVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_58;
  size_t local_50;
  ulong local_48;
  size_t i;
  ptls_raw_extension_t *slots_local;
  uint8_t *end_local;
  uint8_t *src_local;
  uint16_t type_local;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  
  if (((properties != (ptls_handshake_properties_t *)0x0) &&
      (properties->collect_extension !=
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0)) &&
     (iVar1 = (*properties->collect_extension)(tls,properties,type), iVar1 != 0)) {
    for (local_48 = 0; slots[local_48].type != 0xffff; local_48 = local_48 + 1) {
      if (0xf < local_48) {
        __assert_fail("i < MAX_UNKNOWN_EXTENSIONS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0x8f8,
                      "int handle_unknown_extension(ptls_t *, ptls_handshake_properties_t *, uint16_t, const uint8_t *, const uint8_t *const, ptls_raw_extension_t *)"
                     );
      }
      if (slots[local_48].type == type) {
        return 0x2f;
      }
    }
    if (local_48 < 0x10) {
      slots[local_48].type = type;
      pVar2 = ptls_iovec_init(src,(long)end - (long)src);
      local_58 = pVar2.base;
      slots[local_48].data.base = local_58;
      local_50 = pVar2.len;
      slots[local_48].data.len = local_50;
      slots[local_48 + 1].type = 0xffff;
    }
  }
  return 0;
}

Assistant:

static int handle_unknown_extension(ptls_t *tls, ptls_handshake_properties_t *properties, uint16_t type, const uint8_t *src,
                                    const uint8_t *const end, ptls_raw_extension_t *slots)
{

    if (properties != NULL && properties->collect_extension != NULL && properties->collect_extension(tls, properties, type)) {
        size_t i;
        for (i = 0; slots[i].type != UINT16_MAX; ++i) {
            assert(i < MAX_UNKNOWN_EXTENSIONS);
            if (slots[i].type == type)
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        }
        if (i < MAX_UNKNOWN_EXTENSIONS) {
            slots[i].type = type;
            slots[i].data = ptls_iovec_init(src, end - src);
            slots[i + 1].type = UINT16_MAX;
        }
    }
    return 0;
}